

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multiheadattention.cpp
# Opt level: O3

int __thiscall ncnn::MultiHeadAttention::load_param(MultiHeadAttention *this,ParamDict *pd)

{
  int iVar1;
  float fVar2;
  
  iVar1 = ParamDict::get(pd,0,0);
  this->embed_dim = iVar1;
  iVar1 = ParamDict::get(pd,1,1);
  this->num_heads = iVar1;
  iVar1 = ParamDict::get(pd,2,0);
  this->weight_data_size = iVar1;
  iVar1 = ParamDict::get(pd,3,this->embed_dim);
  this->kdim = iVar1;
  iVar1 = ParamDict::get(pd,4,this->embed_dim);
  this->vdim = iVar1;
  iVar1 = ParamDict::get(pd,5,0);
  this->attn_mask = iVar1;
  fVar2 = ParamDict::get(pd,6,1.0 / SQRT((float)(this->embed_dim / this->num_heads)));
  this->scale = fVar2;
  iVar1 = ParamDict::get(pd,0x12,0);
  this->int8_scale_term = iVar1;
  return 0;
}

Assistant:

int MultiHeadAttention::load_param(const ParamDict& pd)
{
    embed_dim = pd.get(0, 0);
    num_heads = pd.get(1, 1);
    weight_data_size = pd.get(2, 0);
    kdim = pd.get(3, embed_dim);
    vdim = pd.get(4, embed_dim);
    attn_mask = pd.get(5, 0);
    scale = pd.get(6, 1.f / sqrtf(embed_dim / num_heads));
    int8_scale_term = pd.get(18, 0);

    return 0;
}